

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  RK_S32 RVar3;
  int iVar4;
  int iVar5;
  RK_U8 *buf;
  RK_U32 RVar6;
  RK_U32 RVar7;
  RK_U32 RVar8;
  RK_U32 RVar9;
  MppFrameFormat *pMVar10;
  char *pcVar11;
  RK_U32 dst_size;
  RK_U32 src_size;
  RK_U32 dst_h;
  RK_U32 dst_w;
  RK_U32 src_h;
  RK_U32 src_w;
  void *ptr;
  RgaCtx pvStack_290;
  RK_U32 frame_count;
  RgaCtx ctx;
  FILE *fout;
  FILE *fin;
  MppFrame dst_frm;
  MppFrame src_frm;
  MppBuffer dst_buf;
  MppBuffer src_buf;
  RK_U32 local_250;
  RgaTestCmd cmd;
  MPP_RET ret;
  char **argv_local;
  int argc_local;
  
  unique0x100007df = argv;
  _mpp_log_l(4,0,"rga test unit\n");
  cmd.have_input = 0xffffffff;
  dst_buf = (MppBuffer)0x0;
  src_frm = (MppFrame)0x0;
  dst_frm = (MppFrame)0x0;
  fin = (FILE *)0x0;
  fout = (FILE *)0x0;
  ctx = (RgaCtx)0x0;
  pvStack_290 = (RgaCtx)0x0;
  memset((void *)((long)&src_buf + 4),0,0x220);
  RVar3 = rga_test_parse_options(argc,stack0xffffffffffffffd0,(RgaTestCmd *)((long)&src_buf + 4));
  if (RVar3 == 0) {
    pMVar10 = &cmd.src_fmt;
    pcVar11 = cmd.input_file + 0xf8;
    RVar6 = cmd.dst_w;
    RVar7 = cmd.src_w;
    RVar8 = cmd.src_h;
    RVar9 = cmd.dst_h;
    _mpp_log_l(4,0,"src w:%d h:%d fmt:%d dst w:%d h:%d fmt:%d input:%s output:%s\n",0,src_buf._4_4_,
               local_250,cmd.dst_w,cmd.src_w,cmd.src_h,cmd.dst_h,pMVar10,pcVar11);
    RVar2 = local_250;
    RVar1 = src_buf._4_4_;
    iVar4 = src_buf._4_4_ * local_250 * 4;
    iVar5 = cmd.src_w * cmd.src_h * 4;
    if ((cmd.output_file._248_4_ == 0) ||
       (fout = (FILE *)fopen((char *)&cmd.src_fmt,"r"), (FILE *)fout != (FILE *)0x0)) {
      if ((cmd.output_file._252_4_ == 0) ||
         (ctx = fopen(cmd.input_file + 0xf8,"w+"), (FILE *)ctx != (FILE *)0x0)) {
        cmd.have_input = mpp_buffer_get_with_tag(0,&dst_buf,iVar4,0,"main");
        if (cmd.have_input == 0) {
          cmd.have_input = mpp_buffer_get_with_tag(0,&src_frm,iVar5,0,"main");
          if (cmd.have_input == 0) {
            cmd.have_input = mpp_frame_init(&dst_frm);
            if (cmd.have_input == 0) {
              cmd.have_input = mpp_frame_init(&fin);
              if (cmd.have_input == 0) {
                buf = (RK_U8 *)mpp_buffer_get_ptr_with_caller(dst_buf,"main");
                if (cmd.output_file._248_4_ == 0) {
                  cmd.have_input =
                       fill_image(buf,src_buf._4_4_,local_250,src_buf._4_4_,local_250,cmd.dst_w,0);
                  if (cmd.have_input != MPP_OK) {
                    _mpp_log_l(2,0,"failed to fill input buffer ret:%d\n",0,cmd.have_input);
                    goto LAB_00102cc5;
                  }
                }
                else {
                  cmd.have_input =
                       read_image(buf,fout,src_buf._4_4_,local_250,src_buf._4_4_,local_250,cmd.dst_h
                                 );
                  if (cmd.have_input != MPP_OK) {
                    _mpp_log_l(2,0,"failed to read input file ret:%d\n",0,cmd.have_input);
                    goto LAB_00102cc5;
                  }
                }
                cmd.have_input = 0;
                mpp_frame_set_buffer(dst_frm,dst_buf);
                mpp_frame_set_width(dst_frm,RVar1);
                mpp_frame_set_height(dst_frm,RVar2);
                mpp_frame_set_hor_stride(dst_frm,RVar1 + 0xf & 0xfffffff0);
                mpp_frame_set_ver_stride(dst_frm,RVar2 + 0xf & 0xfffffff0);
                mpp_frame_set_fmt(dst_frm,cmd.dst_w);
                mpp_frame_set_buffer(fin,src_frm);
                mpp_frame_set_width(fin,cmd.src_w);
                mpp_frame_set_height(fin,cmd.src_h);
                mpp_frame_set_hor_stride(fin,cmd.src_w + 0xf & 0xfffffff0);
                mpp_frame_set_ver_stride(fin,cmd.src_h + 0xf & 0xfffffff0);
                mpp_frame_set_fmt(fin);
                cmd.have_input = rga_init(&stack0xfffffffffffffd70);
                if (cmd.have_input == MPP_OK) {
                  cmd.have_input = rga_control(pvStack_290,RGA_CMD_INIT,(void *)0x0);
                  if (cmd.have_input == MPP_OK) {
                    cmd.have_input = rga_control(pvStack_290,RGA_CMD_SET_SRC,dst_frm);
                    if (cmd.have_input == MPP_OK) {
                      cmd.have_input = rga_control(pvStack_290,RGA_CMD_SET_DST,fin);
                      if (cmd.have_input == MPP_OK) {
                        cmd.have_input = rga_control(pvStack_290,RGA_CMD_RUN_SYNC,(void *)0x0);
                        if (cmd.have_input == MPP_OK) {
                          mpp_frame_set_buffer(dst_frm,src_frm);
                          mpp_frame_set_width(dst_frm,cmd.src_w);
                          mpp_frame_set_height(dst_frm,cmd.src_h >> 1);
                          mpp_frame_set_hor_stride(dst_frm,(cmd.src_w + 0xf & 0xfffffff0) << 1);
                          mpp_frame_set_ver_stride(dst_frm,(RVar2 + 0xf & 0xfffffff0) >> 1);
                          mpp_frame_set_fmt(dst_frm);
                          cmd.have_input = rga_control(pvStack_290,RGA_CMD_INIT,(void *)0x0);
                          if (cmd.have_input == MPP_OK) {
                            cmd.have_input = rga_control(pvStack_290,RGA_CMD_SET_SRC,dst_frm);
                            if (cmd.have_input == MPP_OK) {
                              cmd.have_input = rga_control(pvStack_290,RGA_CMD_SET_DST,fin);
                              if (cmd.have_input == MPP_OK) {
                                cmd.have_input =
                                     rga_control(pvStack_290,RGA_CMD_RUN_SYNC,(void *)0x0);
                                if (cmd.have_input == MPP_OK) {
                                  cmd.have_input = rga_deinit(pvStack_290);
                                  if (cmd.have_input == MPP_OK) {
                                    if (cmd.output_file._252_4_ != 0) {
                                      dump_mpp_frame_to_file(fin,(FILE *)ctx);
                                    }
                                  }
                                  else {
                                    _mpp_log_l(2,0,"deinit rga context failed %d\n",0,cmd.have_input
                                              );
                                  }
                                }
                                else {
                                  _mpp_log_l(2,0,"rga cmd process copy failed %d\n",0,cmd.have_input
                                            );
                                }
                              }
                              else {
                                _mpp_log_l(2,0,"rga cmd setup destination failed %d\n",0,
                                           cmd.have_input);
                              }
                            }
                            else {
                              _mpp_log_l(2,0,"rga cmd setup source failed %d\n",0,cmd.have_input);
                            }
                          }
                          else {
                            _mpp_log_l(2,0,"rga cmd init failed %d\n",0,cmd.have_input);
                          }
                        }
                        else {
                          _mpp_log_l(2,0,"rga cmd process copy failed %d\n",0,cmd.have_input);
                        }
                      }
                      else {
                        _mpp_log_l(2,0,"rga cmd setup destination failed %d\n",0,cmd.have_input);
                      }
                    }
                    else {
                      _mpp_log_l(2,0,"rga cmd setup source failed %d\n",0,cmd.have_input);
                    }
                  }
                  else {
                    _mpp_log_l(2,0,"rga cmd init failed %d\n",0,cmd.have_input);
                  }
                }
                else {
                  _mpp_log_l(2,0,"init rga context failed %d\n",0,cmd.have_input);
                }
              }
              else {
                _mpp_log_l(2,0,"failed to init dst frame\n");
              }
            }
            else {
              _mpp_log_l(2,0,"failed to init src frame\n");
            }
          }
          else {
            _mpp_log_l(2,0,"failed to get dst buffer %d with size %d\n",0,cmd.have_input,iVar5);
          }
        }
        else {
          _mpp_log_l(2,0,"failed to get src buffer %d with size %d\n",0,cmd.have_input,iVar4,RVar6,
                     RVar7,RVar8,RVar9,pMVar10,pcVar11);
        }
      }
      else {
        _mpp_log_l(4,0,"open output file %s failed\n",0,cmd.input_file + 0xf8);
      }
    }
    else {
      _mpp_log_l(4,0,"open input file %s failed\n",0,&cmd.src_fmt);
    }
  }
  else {
    usage();
  }
LAB_00102cc5:
  if (dst_frm != (MppFrame)0x0) {
    mpp_frame_deinit(&dst_frm);
  }
  if (fin != (FILE *)0x0) {
    mpp_frame_deinit(&fin);
  }
  if (dst_buf != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(dst_buf,"main");
  }
  if (src_frm != (MppFrame)0x0) {
    mpp_buffer_put_with_caller(src_frm,"main");
  }
  if (fout != (FILE *)0x0) {
    fclose((FILE *)fout);
  }
  if (ctx != (RgaCtx)0x0) {
    fclose((FILE *)ctx);
  }
  _mpp_log_l(4,0,"rga test exit ret %d\n",0,cmd.have_input);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    mpp_log("rga test unit\n");

    MPP_RET ret = MPP_NOK;
    RgaTestCmd cmd;
    MppBuffer src_buf = NULL;
    MppBuffer dst_buf = NULL;
    MppFrame src_frm = NULL;
    MppFrame dst_frm = NULL;
    FILE *fin = NULL;
    FILE *fout = NULL;
    RgaCtx ctx = NULL;
    RK_U32 frame_count = 0;

    void *ptr;
    RK_U32 src_w;
    RK_U32 src_h;
    RK_U32 dst_w;
    RK_U32 dst_h;
    RK_U32 src_size;
    RK_U32 dst_size;

    memset(&cmd, 0, sizeof(cmd));
    if (rga_test_parse_options(argc, argv, &cmd)) {
        usage();
        goto END;
    }

    mpp_log("src w:%d h:%d fmt:%d dst w:%d h:%d fmt:%d input:%s output:%s\n",
            cmd.src_w, cmd.src_h, cmd.src_fmt,
            cmd.dst_w, cmd.dst_h, cmd.dst_fmt,
            cmd.input_file, cmd.output_file);

    src_w = cmd.src_w;
    src_h = cmd.src_h;
    dst_w = cmd.dst_w;
    dst_h = cmd.dst_h;
    src_size = src_w * src_h * 4;
    dst_size = dst_w * dst_h * 4;

    if (cmd.have_input) {
        fin = fopen(cmd.input_file, "r");
        if (!fin) {
            mpp_log("open input file %s failed\n", cmd.input_file);
            goto END;
        }
    }

    if (cmd.have_output) {
        fout = fopen(cmd.output_file, "w+");
        if (!fout) {
            mpp_log("open output file %s failed\n", cmd.output_file);
            goto END;
        }
    }

    ret = mpp_buffer_get(NULL, &src_buf, src_size);
    if (ret) {
        mpp_err("failed to get src buffer %d with size %d\n", ret, src_size);
        goto END;
    }

    ret = mpp_buffer_get(NULL, &dst_buf, dst_size);
    if (ret) {
        mpp_err("failed to get dst buffer %d with size %d\n", ret, dst_size);
        goto END;
    }

    ret = mpp_frame_init(&src_frm);
    if (ret) {
        mpp_err("failed to init src frame\n");
        goto END;
    }

    ret = mpp_frame_init(&dst_frm);
    if (ret) {
        mpp_err("failed to init dst frame\n");
        goto END;
    }

    ptr = mpp_buffer_get_ptr(src_buf);
    if (cmd.have_input) {
        ret = read_image((RK_U8 *)ptr, fin, cmd.src_w, cmd.src_h,
                         cmd.src_w, cmd.src_h, cmd.dst_fmt);
        if (ret) {
            mpp_err("failed to read input file ret:%d\n", ret);
            goto END;
        }
    } else {
        ret = fill_image((RK_U8 *)ptr, cmd.src_w, cmd.src_h,
                         cmd.src_w, cmd.src_h, cmd.src_fmt, frame_count);
        if (ret) {
            mpp_err("failed to fill input buffer ret:%d\n", ret);
            goto END;
        }
    }

    mpp_frame_set_buffer(src_frm, src_buf);
    mpp_frame_set_width(src_frm, src_w);
    mpp_frame_set_height(src_frm, src_h);
    mpp_frame_set_hor_stride(src_frm, MPP_ALIGN(src_w, 16));
    mpp_frame_set_ver_stride(src_frm, MPP_ALIGN(src_h, 16));
    mpp_frame_set_fmt(src_frm, cmd.src_fmt);

    mpp_frame_set_buffer(dst_frm, dst_buf);
    mpp_frame_set_width(dst_frm, dst_w);
    mpp_frame_set_height(dst_frm, dst_h);
    mpp_frame_set_hor_stride(dst_frm, MPP_ALIGN(dst_w, 16));
    mpp_frame_set_ver_stride(dst_frm, MPP_ALIGN(dst_h, 16));
    mpp_frame_set_fmt(dst_frm, cmd.dst_fmt);

    ret = rga_init(&ctx);
    if (ret) {
        mpp_err("init rga context failed %d\n", ret);
        goto END;
    }

    // start copy process
    ret = rga_control(ctx, RGA_CMD_INIT, NULL);
    if (ret) {
        mpp_err("rga cmd init failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_SRC, src_frm);
    if (ret) {
        mpp_err("rga cmd setup source failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_DST, dst_frm);
    if (ret) {
        mpp_err("rga cmd setup destination failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_RUN_SYNC, NULL);
    if (ret) {
        mpp_err("rga cmd process copy failed %d\n", ret);
        goto END;
    }

    // start field duplicate process
    mpp_frame_set_buffer(src_frm, dst_buf);
    mpp_frame_set_width(src_frm, dst_w);
    mpp_frame_set_height(src_frm, dst_h / 2);
    mpp_frame_set_hor_stride(src_frm, MPP_ALIGN(dst_w, 16) * 2);
    mpp_frame_set_ver_stride(src_frm, MPP_ALIGN(src_h, 16) / 2);
    mpp_frame_set_fmt(src_frm, cmd.dst_fmt);

    ret = rga_control(ctx, RGA_CMD_INIT, NULL);
    if (ret) {
        mpp_err("rga cmd init failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_SRC, src_frm);
    if (ret) {
        mpp_err("rga cmd setup source failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_DST, dst_frm);
    if (ret) {
        mpp_err("rga cmd setup destination failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_RUN_SYNC, NULL);
    if (ret) {
        mpp_err("rga cmd process copy failed %d\n", ret);
        goto END;
    }

    ret = rga_deinit(ctx);
    if (ret) {
        mpp_err("deinit rga context failed %d\n", ret);
        goto END;
    }

    if (cmd.have_output)
        dump_mpp_frame_to_file(dst_frm, fout);

END:
    if (src_frm)
        mpp_frame_deinit(&src_frm);

    if (dst_frm)
        mpp_frame_deinit(&dst_frm);

    if (src_buf)
        mpp_buffer_put(src_buf);

    if (dst_buf)
        mpp_buffer_put(dst_buf);

    if (fin)
        fclose(fin);

    if (fout)
        fclose(fout);

    mpp_log("rga test exit ret %d\n", ret);
    return 0;
}